

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_setup_all0(APITests *this)

{
  int iVar1;
  bool bVar2;
  iterator container;
  reference piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDI;
  int pin;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *element;
  
  GPIO::setmode(BOARD);
  element = in_RDI + 0x14;
  container = std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffc8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffc8);
  while (bVar2 = __gnu_cxx::operator!=
                           (in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)in_stack_ffffffffffffffc8), bVar2) {
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &stack0xffffffffffffffe8);
    iVar1 = *piVar3;
    bVar2 = is_in<int&,std::vector<int,std::allocator<int>>&>
                      ((int *)element,(vector<int,_std::allocator<int>_> *)container._M_current);
    if (!bVar2) {
      GPIO::setup(iVar1,IN,-1);
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffe8);
  }
  GPIO::cleanup();
  return;
}

Assistant:

void test_setup_all0()
    {
        GPIO::setmode(GPIO::BOARD);
        for (auto pin : all_board_pins)
        {
            if (is_in(pin, pin_data.unimplemented_pins))
                continue;
            GPIO::setup(pin, GPIO::IN);
        }
        GPIO::cleanup();
    }